

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O0

void __thiscall wasm::DataFlowOpts::replaceAllUsesWith(DataFlowOpts *this,Node *node,Node *with)

{
  Index index_00;
  Expression *expr_00;
  bool bVar1;
  UserSet *this_00;
  reference ppNVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppNVar5;
  reference puVar6;
  Expression *pEVar7;
  Expression **ppEVar8;
  pair<std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>,_bool> pVar9;
  iterator iStack_a8;
  uint index;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  Expression *expr;
  value_type_conflict2 local_74;
  undefined1 local_70 [4];
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Node *local_48;
  Node *user;
  iterator __end2;
  iterator __begin2;
  UserSet *__range2;
  UserSet *users;
  Node *with_local;
  Node *node_local;
  DataFlowOpts *this_local;
  
  bVar1 = DataFlow::Node::isConst(with);
  if (!bVar1) {
    __assert_fail("with->isConst()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                  ,0xac,
                  "void wasm::DataFlowOpts::replaceAllUsesWith(DataFlow::Node *, DataFlow::Node *)")
    ;
  }
  this_00 = DataFlow::Users::getUsers(&this->nodeUsers,node);
  __end2 = std::
           unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
           ::begin(this_00);
  user = (Node *)std::
                 unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
                 ::end(this_00);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>,
                       (_Node_iterator_base<wasm::DataFlow::Node_*,_false> *)&user);
    if (!bVar1) {
      DataFlow::Users::removeAllUsesOf(&this->nodeUsers,node);
      return;
    }
    ppNVar2 = std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>::operator*(&__end2)
    ;
    local_48 = *ppNVar2;
    pVar9 = std::
            unordered_set<wasm::DataFlow::Node_*,_std::hash<wasm::DataFlow::Node_*>,_std::equal_to<wasm::DataFlow::Node_*>,_std::allocator<wasm::DataFlow::Node_*>_>
            ::insert(&this->workLeft,&local_48);
    indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)pVar9.first.super__Node_iterator_base<wasm::DataFlow::Node_*,_false>._M_cur;
    DataFlow::Users::addUser(&this->nodeUsers,with,local_48);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    for (local_74 = 0; uVar3 = (ulong)local_74,
        sVar4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                          (&local_48->values), uVar3 < sVar4; local_74 = local_74 + 1) {
      ppNVar5 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                operator[](&local_48->values,(ulong)local_74);
      if (*ppNVar5 == node) {
        ppNVar5 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[](&local_48->values,(ulong)local_74);
        *ppNVar5 = with;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_74);
      }
    }
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    switch(local_48->type) {
    case Expr:
      expr_00 = (local_48->field_1).expr;
      __end4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      iStack_a8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xffffffffffffff58), bVar1) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end4);
        index_00 = *puVar6;
        pEVar7 = DataFlow::Graph::makeUse(&this->graph,with);
        ppEVar8 = getIndexPointer(this,expr_00,index_00);
        *ppEVar8 = pEVar7;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end4);
      }
      break;
    case Phi:
      break;
    case Cond:
      break;
    default:
      handle_unreachable("unexpected dataflow node type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                         ,0xdc);
    case Zext:
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
    std::__detail::_Node_iterator<wasm::DataFlow::Node_*,_true,_false>::operator++(&__end2);
  }
  __assert_fail("!indexes.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                ,0xbd,
                "void wasm::DataFlowOpts::replaceAllUsesWith(DataFlow::Node *, DataFlow::Node *)");
}

Assistant:

void replaceAllUsesWith(DataFlow::Node* node, DataFlow::Node* with) {
    // Const nodes are trivial to replace, but other stuff is trickier -
    // in particular phis.
    assert(with->isConst()); // TODO
    // All the users should be worked on later, as we will update them.
    auto& users = nodeUsers.getUsers(node);
    for (auto* user : users) {
      // Add the user to the work left to do, as we are modifying it.
      workLeft.insert(user);
      // `with` is getting another user.
      nodeUsers.addUser(with, user);
      // Replacing in the DataFlow IR is simple - just replace it,
      // in all the indexes it appears.
      std::vector<Index> indexes;
      for (Index i = 0; i < user->values.size(); i++) {
        if (user->values[i] == node) {
          user->values[i] = with;
          indexes.push_back(i);
        }
      }
      assert(!indexes.empty());
      // Replacing in the Binaryen IR requires more care
      switch (user->type) {
        case DataFlow::Node::Type::Expr: {
          auto* expr = user->expr;
          for (auto index : indexes) {
            *(getIndexPointer(expr, index)) = graph.makeUse(with);
          }
          break;
        }
        case DataFlow::Node::Type::Phi: {
          // Nothing to do: a phi is not in the Binaryen IR.
          // If the entire phi can become a constant, that will be
          // propagated when we process that phi later.
          break;
        }
        case DataFlow::Node::Type::Cond: {
          // Nothing to do: a cond is not in the Binaryen IR.
          // If the cond input is a constant, that might indicate
          // useful optimizations are possible, which perhaps we
          // should look into TODO
          break;
        }
        case DataFlow::Node::Type::Zext: {
          // Nothing to do: a zext is not in the Binaryen IR.
          // If the cond input is a constant, that might indicate
          // useful optimizations are possible, which perhaps we
          // should look into TODO
          break;
        }
        default:
          WASM_UNREACHABLE("unexpected dataflow node type");
      }
    }
    // No one is a user of this node after we replaced all the uses.
    nodeUsers.removeAllUsesOf(node);
  }